

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O0

void __thiscall
stateObservation::LipmDcmEstimator::setInputs
          (LipmDcmEstimator *this,Vector2 *dcm,Vector2 *zmp,Matrix2 *orientation,
          Vector2 *CoMOffset_gamma,double ZMPCoef_kappa)

{
  DenseBase<Eigen::Matrix<double,4,1,0,4,1>> *this_00;
  bool bVar1;
  TimeSize TVar2;
  ConstantReturnType local_158;
  Vector2 local_148;
  Scalar local_130;
  ConstantReturnType local_128;
  Vector2 local_118;
  Type local_100;
  non_const_type local_d0;
  Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Transpose<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_0>
  local_c8;
  Matrix<double,__1,_1,_0,__1,_1> local_b8;
  Matrix<double,__1,_1,_0,__1,_1> local_a8 [2];
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_88;
  undefined1 local_68 [8];
  Vector2 y;
  Vector4 u;
  double ZMPCoef_kappa_local;
  Vector2 *CoMOffset_gamma_local;
  Matrix2 *orientation_local;
  Vector2 *zmp_local;
  Vector2 *dcm_local;
  LipmDcmEstimator *this_local;
  
  setUnbiasedCoMOffset(this,CoMOffset_gamma);
  setZMPCoef(this,ZMPCoef_kappa);
  bVar1 = ZeroDelayObserver::stateIsSet((ZeroDelayObserver *)&this->filter_);
  if (bVar1) {
    TVar2 = ZeroDelayObserver::getMeasurementsNumber((ZeroDelayObserver *)&this->filter_);
    if (1 < TVar2) {
      update(this);
    }
    this_00 = (DenseBase<Eigen::Matrix<double,4,1,0,4,1>> *)
              (y.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
              + 1);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_00);
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_68);
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=((Matrix<double,_2,_1,_0,_2,_1> *)local_68,dcm);
    Eigen::DenseBase<Eigen::Matrix<double,4,1,0,4,1>>::operator<<
              (&local_88,this_00,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&this->previousZmp_);
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_88,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&this->gamma_);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer(&local_88);
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=(&this->previousZmp_,zmp);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
              ((Matrix<double,_1,1,0,_1,1> *)local_a8,
               (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_68);
    ZeroDelayObserver::pushMeasurement
              ((ZeroDelayObserver *)&this->filter_,(MeasureVector *)local_a8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(local_a8);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,4,1,0,4,1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_b8,
               (EigenBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
               (y.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array + 1));
    ZeroDelayObserver::pushInput((ZeroDelayObserver *)&this->filter_,(InputVector *)&local_b8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_b8);
    local_d0 = (non_const_type)
               Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                          &this->previousOrientation_);
    local_c8 = Eigen::MatrixBase<Eigen::Matrix<double,2,2,0,2,2>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,2,2,0,2,2>> *)orientation,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_> *)
                          &local_d0);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::bottomRightCorner<2,2>
              (&local_100,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)&this->A_);
    Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,2,2,false>::operator=
              ((Block<Eigen::Matrix<double,4,4,0,4,4>,2,2,false> *)&local_100,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Transpose<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_0>_>
                *)&local_c8);
    Eigen::Matrix<double,_2,_2,_0,_2,_2>::operator=(&this->previousOrientation_,orientation);
  }
  else {
    local_130 = 0.0;
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Constant(&local_128,&local_130);
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((Matrix<double,2,1,0,2,1> *)&local_118,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&local_128);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Constant
              (&local_158,(Scalar *)&defaultBiasUncertainty);
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((Matrix<double,2,1,0,2,1> *)&local_148,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&local_158);
    resetWithMeasurements(this,dcm,zmp,orientation,true,&local_118,&local_148);
  }
  return;
}

Assistant:

void LipmDcmEstimator::setInputs(const Vector2 & dcm,
                                 const Vector2 & zmp,
                                 const Matrix2 & orientation,
                                 const Vector2 & CoMOffset_gamma,
                                 const double ZMPCoef_kappa)
{
  setUnbiasedCoMOffset(CoMOffset_gamma);
  setZMPCoef(ZMPCoef_kappa);
  if(filter_.stateIsSet())
  {
    if(filter_.getMeasurementsNumber() > 1)
    {
      update(); /// update the estimation of the state to synchronize with the measurements
    }

    Vector4 u;
    Vector2 y;

    y = dcm;

    /// The prediction of the state depends on the previous value of the ZMP
    u << previousZmp_, gamma_;
    previousZmp_ = zmp;

    filter_.pushMeasurement(y);
    filter_.pushInput(u);

    A_.bottomRightCorner<2, 2>() = orientation * previousOrientation_.transpose(); /// set the rotation difference
    previousOrientation_ = orientation;
  }
  else
  {
    resetWithMeasurements(dcm, zmp, orientation, true);
  }
}